

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<256>,unsigned_long>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  double dVar2;
  double dVar3;
  bool result;
  int i;
  unsigned_long h2;
  unsigned_long h1;
  Blob<256> k2;
  Blob<256> k1;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_ffffffffffffff0c;
  Rand *in_stack_ffffffffffffff10;
  Blob<256> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int iVar4;
  Rand *this;
  int local_c4;
  undefined1 local_b8 [4];
  int in_stack_ffffffffffffff4c;
  unsigned_long *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Blob<256> *in_stack_ffffffffffffff60;
  Blob<256> *in_stack_ffffffffffffff68;
  pfHash in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff80;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffff88;
  
  dVar2 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(int)in_stack_ffffffffffffff10
                     );
  this = (Rand *)(dVar2 * (double)(int)in_EDX);
  dVar3 = pow(2.0,64.0);
  dVar3 = (double)this / dVar3;
  Rand::Rand(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x14b251);
  Blob<256>::Blob((Blob<256> *)&stack0xffffffffffffff80);
  Blob<256>::Blob((Blob<256> *)&stack0xffffffffffffff54);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",dVar2,
         (ulong)in_ESI,0x100,0x40);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         (Rand *)(dVar2 * (double)(int)in_EDX),dVar3,(ulong)in_EDX);
  for (local_c4 = 0; local_c4 < (int)in_EDX; local_c4 = local_c4 + 1) {
    iVar4 = local_c4;
    if (local_c4 % ((int)in_EDX / 10) == 0) {
      printf(".");
    }
    Rand::rand_p(this,(void *)CONCAT44(iVar4,in_stack_ffffffffffffff28),
                 (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    in_stack_ffffffffffffff20 = (Blob<256> *)&stack0xffffffffffffff80;
    Blob<256>::operator=((Blob<256> *)&stack0xffffffffffffff54,in_stack_ffffffffffffff20);
    (*in_RDI)(in_stack_ffffffffffffff20,0x20,0,local_b8);
    DiffTestRecurse<Blob<256>,unsigned_long>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff88);
  }
  printf("\n");
  bVar1 = ProcessDifferentials<Blob<256>>
                    ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff5c,SUB41(in_stack_ffffffffffffff58,3));
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)in_stack_ffffffffffffff20);
  return bVar1;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}